

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitArrayNewElem
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          ArrayNewElem *curr)

{
  char **this_00;
  ulong uVar1;
  Literal *pLVar2;
  uint64_t uVar3;
  uint64_t reservedSize;
  ElementSegment *pEVar4;
  size_type sVar5;
  Flow local_188;
  undefined1 local_140 [8];
  Flow offsetFlow;
  Flow sizeFlow;
  Literal val;
  Literals contents;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_140,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->offset);
  if (offsetFlow.breakTo.super_IString.str._M_len != 0) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_140);
    goto LAB_00d54363;
  }
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)&offsetFlow.breakTo.super_IString.str._M_str,
             &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->size);
  if (sizeFlow.breakTo.super_IString.str._M_len == 0) {
    pLVar2 = Flow::getSingleValue((Flow *)local_140);
    uVar3 = Literal::getUnsigned(pLVar2);
    pLVar2 = Flow::getSingleValue((Flow *)&offsetFlow.breakTo.super_IString.str._M_str);
    reservedSize = Literal::getUnsigned(pLVar2);
    contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
    contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
    _M_str = (char *)0x0;
    contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    val.type.id = 0;
    contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    pEVar4 = Module::getElementSegment(this->wasm,(Name)(curr->segment).super_IString.str);
    uVar1 = reservedSize + uVar3;
    if ((ulong)((long)(pEVar4->data).
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pEVar4->data).
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) < uVar1) {
      (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                (this,"out of bounds segment access in array.new_elem");
LAB_00d54278:
      sVar5 = std::
              _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::count(&(this->droppedElementSegments)._M_h,&curr->segment);
      if (sVar5 != 0) {
        (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                  (this,"out of bounds segment access in array.new_elem");
      }
    }
    else if (uVar1 != 0) goto LAB_00d54278;
    SmallVector<wasm::Literal,_1UL>::reserve
              ((SmallVector<wasm::Literal,_1UL> *)&val.type,reservedSize);
    this_00 = &sizeFlow.breakTo.super_IString.str._M_str;
    for (; (uVar3 & 0xffffffff) < uVar1; uVar3 = (uint64_t)((int)uVar3 + 1)) {
      ExpressionRunner<wasm::ModuleRunner>::visit
                (&local_188,&this->super_ExpressionRunner<wasm::ModuleRunner>,
                 (pEVar4->data).
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar3 & 0xffffffff]);
      pLVar2 = Flow::getSingleValue(&local_188);
      Literal::Literal((Literal *)this_00,pLVar2);
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)&local_188);
      SmallVector<wasm::Literal,_1UL>::push_back
                ((SmallVector<wasm::Literal,_1UL> *)&val.type,(Literal *)this_00);
      Literal::~Literal((Literal *)this_00);
    }
    ExpressionRunner<wasm::ModuleRunner>::makeGCData
              ((Literal *)
               &contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,(Literals *)&val.type,
               (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression.
                     type.id);
    Flow::Flow(__return_storage_ptr__,
               (Literal *)
               &contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    Literal::~Literal((Literal *)
                      &contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
                       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)&val.type);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)&offsetFlow.breakTo.super_IString.str._M_str);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)&offsetFlow.breakTo.super_IString.str._M_str);
LAB_00d54363:
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_140);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayNewElem(ArrayNewElem* curr) {
    NOTE_ENTER("ArrayNewElem");
    auto offsetFlow = self()->visit(curr->offset);
    if (offsetFlow.breaking()) {
      return offsetFlow;
    }
    auto sizeFlow = self()->visit(curr->size);
    if (sizeFlow.breaking()) {
      return sizeFlow;
    }

    uint64_t offset = offsetFlow.getSingleValue().getUnsigned();
    uint64_t size = sizeFlow.getSingleValue().getUnsigned();

    Literals contents;

    const auto& seg = *wasm.getElementSegment(curr->segment);
    auto end = offset + size;
    if (end > seg.data.size()) {
      trap("out of bounds segment access in array.new_elem");
    }
    if (end > 0 && droppedElementSegments.count(curr->segment)) {
      trap("out of bounds segment access in array.new_elem");
    }
    contents.reserve(size);
    for (Index i = offset; i < end; ++i) {
      auto val = self()->visit(seg.data[i]).getSingleValue();
      contents.push_back(val);
    }
    return self()->makeGCData(std::move(contents), curr->type);
  }